

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qatomic_cxx11.h
# Opt level: O0

int QAtomicOps<int>::fetchAndAddRelease<int>(atomic<int> *_q_value,AdditiveT valueToAdd)

{
  int iVar1;
  AdditiveT valueToAdd_local;
  atomic<int> *_q_value_local;
  
  LOCK();
  iVar1 = (_q_value->super___atomic_base<int>)._M_i;
  (_q_value->super___atomic_base<int>)._M_i = (_q_value->super___atomic_base<int>)._M_i + valueToAdd
  ;
  UNLOCK();
  return iVar1;
}

Assistant:

static inline
    T fetchAndAddRelease(std::atomic<T> &_q_value, typename QAtomicAdditiveType<T>::AdditiveT valueToAdd) noexcept
    {
        return _q_value.fetch_add(valueToAdd, std::memory_order_release);
    }